

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

char * foodword(obj *otmp)

{
  obj *otmp_local;
  
  if (otmp->oclass == '\a') {
    otmp_local = (obj *)0x3597ac;
  }
  else {
    if (((otmp->oclass == '\r') &&
        ((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) == 0x13)) &&
       ((*(uint *)&otmp->field_0x4a >> 5 & 1) != 0)) {
      discover_object((int)otmp->otyp,'\x01','\x01');
    }
    otmp_local = (obj *)foodwords[*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f];
  }
  return (char *)otmp_local;
}

Assistant:

static const char *foodword(struct obj *otmp)
{
	if (otmp->oclass == FOOD_CLASS) return "food";
	if (otmp->oclass == GEM_CLASS &&
	    objects[otmp->otyp].oc_material == GLASS &&
	    otmp->dknown)
		makeknown(otmp->otyp);
	return foodwords[objects[otmp->otyp].oc_material];
}